

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * calculateFiller(QString *__return_storage_ptr__,qsizetype padding,char32_t fillChar,
                         qsizetype fieldWidth,QLocaleData *localeData)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  QChar local_1c [2];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (fillChar == L'0') {
    QLocaleData::zeroDigit((QString *)&local_38,(QLocaleData *)fieldWidth);
  }
  else {
    local_1c = (QChar  [2])QChar::fromUcs4(fillChar);
    QString::QString((QString *)&local_38,local_1c,2 - (ulong)((uint)local_1c < 0x10000));
  }
  pDVar2 = (__return_storage_ptr__->d).d;
  pcVar3 = (__return_storage_ptr__->d).ptr;
  (__return_storage_ptr__->d).d = local_38.d;
  (__return_storage_ptr__->d).ptr = local_38.ptr;
  qVar1 = (__return_storage_ptr__->d).size;
  (__return_storage_ptr__->d).size = local_38.size;
  local_38.d = pDVar2;
  local_38.ptr = pcVar3;
  local_38.size = qVar1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (1 < padding) {
    QString::repeated((QString *)&local_38,__return_storage_ptr__,padding);
    pDVar2 = (__return_storage_ptr__->d).d;
    pcVar3 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_38.d;
    (__return_storage_ptr__->d).ptr = local_38.ptr;
    qVar1 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_38.size;
    local_38.d = pDVar2;
    local_38.ptr = pcVar3;
    local_38.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString calculateFiller(qsizetype padding,
                               char32_t fillChar,
                               [[maybe_unused]] qsizetype fieldWidth,
                               const QLocaleData *localeData)
{
    QString filler;
    if (fillChar == U'0') {
        Q_ASSERT(fieldWidth < 0);
        filler = localeData->zeroDigit();
    } else {
        filler = QString(QChar::fromUcs4(fillChar));
    }
    // ### size is not width
    if (padding > 1)
        filler = filler.repeated(padding);
    return filler;
}